

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void PushInterval(CostManager *manager,double distance_cost,int position,int len)

{
  double dVar1;
  long lVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  float fVar6;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  int end_original;
  int start_new;
  float cost;
  int end;
  int start;
  float cost_tmp;
  int k;
  int j;
  int kSkipDistance;
  CostCacheInterval *cost_cache_intervals;
  CostInterval *interval_next;
  CostInterval *interval;
  size_t i;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  int iVar7;
  int iVar8;
  uint in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float local_4c;
  int local_40;
  float *local_28;
  ulong local_20;
  
  local_28 = (float *)*in_RDI;
  lVar2 = in_RDI[2];
  local_40 = in_ESI;
  if (in_EDX < 10) {
    for (; local_40 < in_ESI + in_EDX; local_40 = local_40 + 1) {
      if ((float)(in_XMM0_Qa + (double)in_RDI[(long)(local_40 - in_ESI) + 4]) <
          *(float *)(in_RDI[0x1003] + (long)local_40 * 4)) {
        *(float *)(in_RDI[0x1003] + (long)local_40 * 4) =
             (float)(in_XMM0_Qa + (double)in_RDI[(long)(local_40 - in_ESI) + 4]);
        *(short *)(in_RDI[0x1004] + (long)local_40 * 2) = (short)(local_40 - in_ESI) + 1;
      }
    }
  }
  else {
    local_20 = 0;
    while( true ) {
      uVar5 = in_stack_ffffffffffffffa0 & 0xffffff;
      if (local_20 < (ulong)in_RDI[3]) {
        uVar5 = CONCAT13(*(int *)(lVar2 + local_20 * 0x10 + 8) < in_EDX,
                         (int3)in_stack_ffffffffffffffa0);
      }
      in_stack_ffffffffffffffa0 = uVar5;
      if ((char)(in_stack_ffffffffffffffa0 >> 0x18) == '\0') break;
      local_4c = (float)(in_ESI + *(int *)(lVar2 + local_20 * 0x10 + 8));
      iVar7 = in_EDX;
      if (*(int *)(lVar2 + local_20 * 0x10 + 0xc) <= in_EDX) {
        iVar7 = *(int *)(lVar2 + local_20 * 0x10 + 0xc);
      }
      fVar6 = (float)(in_ESI + iVar7);
      dVar1 = *(double *)(lVar2 + local_20 * 0x10);
      iVar8 = in_ESI;
      pfVar3 = local_28;
      do {
        while( true ) {
          do {
            local_28 = pfVar3;
            fVar4 = (float)((uint)in_stack_ffffffffffffff94 & 0xffffff);
            if (local_28 != (float *)0x0) {
              fVar4 = (float)CONCAT13((int)local_28[1] < (int)fVar6,
                                      SUB43(in_stack_ffffffffffffff94,0));
            }
            in_stack_ffffffffffffff94 = fVar4;
            if ((char)((uint)in_stack_ffffffffffffff94 >> 0x18) == '\0') goto LAB_001a26e5;
            pfVar3 = *(float **)(local_28 + 6);
          } while ((int)local_28[2] <= (int)local_4c);
          if (*local_28 <= (float)(in_XMM0_Qa + dVar1)) break;
          if ((int)local_28[1] < (int)local_4c) {
            if ((int)fVar6 < (int)local_28[2]) {
              in_stack_ffffffffffffffa4 = local_28[2];
              local_28[2] = local_4c;
              InsertInterval((CostManager *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (CostInterval *)CONCAT44(iVar8,iVar7),in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                             in_stack_ffffffffffffff88);
              local_28 = *(float **)(local_28 + 6);
              goto LAB_001a26e5;
            }
            local_28[2] = local_4c;
          }
          else {
            if ((int)fVar6 < (int)local_28[2]) {
              local_28[1] = fVar6;
              goto LAB_001a26e5;
            }
            PopInterval((CostManager *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                        ,(CostInterval *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          }
        }
        local_4c = local_28[2];
        InsertInterval((CostManager *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (CostInterval *)CONCAT44(iVar8,iVar7),in_stack_ffffffffffffff94,
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                      );
      } while ((int)local_4c < (int)fVar6);
LAB_001a26e5:
      InsertInterval((CostManager *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (CostInterval *)CONCAT44(iVar8,iVar7),in_stack_ffffffffffffff94,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void PushInterval(CostManager* const manager,
                                     double distance_cost, int position,
                                     int len) {
  size_t i;
  CostInterval* interval = manager->head_;
  CostInterval* interval_next;
  const CostCacheInterval* const cost_cache_intervals =
      manager->cache_intervals_;
  // If the interval is small enough, no need to deal with the heavy
  // interval logic, just serialize it right away. This constant is empirical.
  const int kSkipDistance = 10;

  if (len < kSkipDistance) {
    int j;
    for (j = position; j < position + len; ++j) {
      const int k = j - position;
      float cost_tmp;
      assert(k >= 0 && k < MAX_LENGTH);
      cost_tmp = (float)(distance_cost + manager->cost_cache_[k]);

      if (manager->costs_[j] > cost_tmp) {
        manager->costs_[j] = cost_tmp;
        manager->dist_array_[j] = k + 1;
      }
    }
    return;
  }

  for (i = 0; i < manager->cache_intervals_size_ &&
              cost_cache_intervals[i].start_ < len;
       ++i) {
    // Define the intersection of the ith interval with the new one.
    int start = position + cost_cache_intervals[i].start_;
    const int end = position + (cost_cache_intervals[i].end_ > len
                                 ? len
                                 : cost_cache_intervals[i].end_);
    const float cost = (float)(distance_cost + cost_cache_intervals[i].cost_);

    for (; interval != NULL && interval->start_ < end;
         interval = interval_next) {
      interval_next = interval->next_;

      // Make sure we have some overlap
      if (start >= interval->end_) continue;

      if (cost >= interval->cost_) {
        // When intervals are represented, the lower, the better.
        // [**********************************************************[
        // start                                                    end
        //                   [----------------------------------[
        //                   interval->start_       interval->end_
        // If we are worse than what we already have, add whatever we have so
        // far up to interval.
        const int start_new = interval->end_;
        InsertInterval(manager, interval, cost, position, start,
                       interval->start_);
        start = start_new;
        if (start >= end) break;
        continue;
      }

      if (start <= interval->start_) {
        if (interval->end_ <= end) {
          //                   [----------------------------------[
          //                   interval->start_       interval->end_
          // [**************************************************************[
          // start                                                        end
          // We can safely remove the old interval as it is fully included.
          PopInterval(manager, interval);
        } else {
          //              [------------------------------------[
          //              interval->start_        interval->end_
          // [*****************************[
          // start                       end
          interval->start_ = end;
          break;
        }
      } else {
        if (end < interval->end_) {
          // [--------------------------------------------------------------[
          // interval->start_                                  interval->end_
          //                     [*****************************[
          //                     start                       end
          // We have to split the old interval as it fully contains the new one.
          const int end_original = interval->end_;
          interval->end_ = start;
          InsertInterval(manager, interval, interval->cost_, interval->index_,
                         end, end_original);
          interval = interval->next_;
          break;
        } else {
          // [------------------------------------[
          // interval->start_        interval->end_
          //                     [*****************************[
          //                     start                       end
          interval->end_ = start;
        }
      }
    }
    // Insert the remaining interval from start to end.
    InsertInterval(manager, interval, cost, position, start, end);
  }
}